

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O1

void API::createIndex(IndexInfo *indexInfo)

{
  _Rb_tree_color _Var1;
  pointer pcVar2;
  Addr p_00;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  long *plVar6;
  ostream *this;
  long *plVar7;
  Addr p;
  string filename;
  value v;
  Addr local_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  value local_238;
  char *local_208;
  RecordSet *local_200;
  undefined1 local_1f8 [8];
  _Alloc_hider local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  int local_1d0;
  float fStack_1cc;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  char local_150 [16];
  _Alloc_hider local_140;
  char local_130 [16];
  _Alloc_hider local_120;
  char local_110 [16];
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  char local_e8 [16];
  _Alloc_hider local_d8;
  char local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  char local_80 [16];
  _Alloc_hider local_70;
  char local_60 [16];
  _Alloc_hider local_50;
  char local_40 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"create index ------------------\n",0x20);
  bVar3 = catalog::createIndex(&CM,indexInfo);
  if (bVar3) {
    pcVar2 = (indexInfo->tableName)._M_dataplus._M_p;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,pcVar2,pcVar2 + (indexInfo->tableName)._M_string_length);
    iVar4 = catalog::existTable(&CM,&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(CM.TableInfoList.super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar4]->getID)._M_t,
                   &indexInfo->colunmName);
    _Var1 = iVar5._M_node[2]._M_color;
    indexInfo->type =
         (CM.TableInfoList.super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4]->type).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [(int)_Var1];
    indexInfo->indexID = _Var1;
    local_98._0_4_ = indexInfo->indexID;
    local_98._4_4_ = indexInfo->type;
    local_90._M_p = local_80;
    pcVar2 = (indexInfo->indexName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar2,pcVar2 + (indexInfo->indexName)._M_string_length);
    local_70._M_p = local_60;
    pcVar2 = (indexInfo->tableName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (indexInfo->tableName)._M_string_length);
    local_50._M_p = local_40;
    pcVar2 = (indexInfo->colunmName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (indexInfo->colunmName)._M_string_length);
    IndexManager::CreateIndexFile(&IM,(IndexInfo *)local_98);
    IndexInfo::~IndexInfo((IndexInfo *)local_98);
    local_260.BlockNum = 1;
    local_260.FileOff = 0;
    local_238.charV._M_dataplus._M_p = (pointer)&local_238.charV.field_2;
    local_238.charV._M_string_length = 0;
    local_238.charV.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_1a8,&RM.Direction,&indexInfo->tableName);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_258 = &local_248;
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_248 = *plVar7;
      lStack_240 = plVar6[3];
    }
    else {
      local_248 = *plVar7;
      local_258 = (long *)*plVar6;
    }
    local_250 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_258,local_250 + (long)local_258);
    local_200 = RecordManager::FindRecordSet(&RM,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    local_208 = local_150;
    while( true ) {
      do {
        local_100._0_4_ = indexInfo->indexID;
        local_100._4_4_ = indexInfo->type;
        pcVar2 = (indexInfo->indexName)._M_dataplus._M_p;
        local_f8._M_p = local_e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,pcVar2,pcVar2 + (indexInfo->indexName)._M_string_length);
        local_d8._M_p = local_c8;
        pcVar2 = (indexInfo->tableName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar2,pcVar2 + (indexInfo->tableName)._M_string_length);
        local_b8._M_p = local_a8;
        pcVar2 = (indexInfo->colunmName)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar2,pcVar2 + (indexInfo->colunmName)._M_string_length);
        iVar4 = RecordManager::ReturnKP(&RM,(IndexInfo *)local_100,local_260,&local_238);
        IndexInfo::~IndexInfo((IndexInfo *)local_100);
      } while (iVar4 == 0);
      if (iVar4 == -1) break;
      local_168._0_4_ = indexInfo->indexID;
      local_168._4_4_ = indexInfo->type;
      local_160._M_p = local_150;
      pcVar2 = (indexInfo->indexName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar2,pcVar2 + (indexInfo->indexName)._M_string_length);
      local_140._M_p = local_130;
      pcVar2 = (indexInfo->tableName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_140,pcVar2,pcVar2 + (indexInfo->tableName)._M_string_length);
      local_120._M_p = local_110;
      pcVar2 = (indexInfo->colunmName)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_120,pcVar2,pcVar2 + (indexInfo->colunmName)._M_string_length);
      p_00 = local_260;
      local_1f8._0_4_ = local_238.type;
      local_1f0._M_p = (pointer)&local_1e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,local_238.charV._M_dataplus._M_p,
                 local_238.charV._M_dataplus._M_p + local_238.charV._M_string_length);
      local_1d0 = local_238.intV;
      fStack_1cc = local_238.floatV;
      IndexManager::InsertSuchKey(&IM,(IndexInfo *)local_168,p_00,(value *)local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p,local_1e0._M_allocated_capacity + 1);
      }
      IndexInfo::~IndexInfo((IndexInfo *)local_168);
      RecordSet::Addp(local_200,&local_260);
      this = (ostream *)std::ostream::operator<<(&std::cout,local_260.BlockNum);
      std::__ostream_insert<char,std::char_traits<char>>(this,"\t",1);
      plVar6 = (long *)std::ostream::operator<<(this,local_260.FileOff);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,local_248 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238.charV._M_dataplus._M_p != &local_238.charV.field_2) {
      operator_delete(local_238.charV._M_dataplus._M_p,
                      CONCAT71(local_238.charV.field_2._M_allocated_capacity._1_7_,
                               local_238.charV.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void API::createIndex(IndexInfo *indexInfo){
    std::cout <<"create index ------------------\n";
    if(!CM.createIndex(indexInfo))return;//建立catalog索引
    int pos = CM.existTable(indexInfo->tableName);
    
    auto it = CM.TableInfoList[pos]->getID.find(indexInfo->colunmName);
    indexInfo->type = CM.TableInfoList[pos]->type[it->second];
    indexInfo->indexID = it->second;
    IM.CreateIndexFile(*indexInfo);//建立indexfile

    //将之前插入table的值插入indexfile
    Addr p = {1,0};
    struct value v;
    string filename = RM.Direction + indexInfo->tableName + "_rcd.dat";
    RecordSet& R = RM.FindRecordSet(filename);
    while(1){
        int result = RM.ReturnKP(*indexInfo,p,v);
        if(result == 0)continue;
        else if(result == -1)break;
        IM.InsertSuchKey(*indexInfo,p,v);
        R.Addp(p);
        std::cout << p.BlockNum <<"\t"<<p.FileOff<<std::endl;
    }
}